

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O3

logical pnga_sprs_array_get_block
                  (Integer s_a,Integer irow,Integer icol,void **idx,void **jdx,void **data,
                  Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi)

{
  void *pvVar1;
  Integer IVar2;
  logical lVar3;
  long lVar4;
  long lVar5;
  Integer ld [2];
  Integer lo [3];
  Integer hi [3];
  Integer dummy;
  Integer offset;
  int64_t params [7];
  
  lo[0] = 1;
  lo[1] = irow + 1;
  lo[2] = icol + 1;
  hi[0] = 7;
  ld[0] = 7;
  ld[1] = 1;
  hi[1] = lo[1];
  hi[2] = lo[2];
  pnga_get(SPA[s_a + 1000].g_blk,lo,hi,params,ld);
  *ilo = params[0];
  *ihi = params[1];
  *jlo = params[2];
  *jhi = params[3];
  if (params[5] - params[4] < 0) {
    lVar3 = 0;
  }
  else {
    lVar4 = s_a + 1000;
    lVar5 = (params[5] - params[4]) + 1;
    pvVar1 = malloc((*ihi - *ilo) * 8 + 0x10);
    *idx = pvVar1;
    pvVar1 = malloc(lVar5 * 8);
    *jdx = pvVar1;
    pvVar1 = malloc(SPA[lVar4].size * lVar5);
    *data = pvVar1;
    lo[0] = params[4];
    hi[0] = params[5];
    ld[0] = 1;
    pnga_get(SPA[lVar4].g_j,lo,hi,*jdx,ld);
    pnga_get(SPA[lVar4].g_data,lo,hi,*data,ld);
    if ((int)params[6] == -1) {
      IVar2 = pnga_nodeid();
      printf("p[%d] irow: %d icol: %d iblk: %d ilo: %d ihi: %d jlo: %d jhi: %d len: %d\n",IVar2,irow
             ,icol,0xffffffff,*ilo,*ihi,*jlo,*jhi,lVar5);
      pnga_error("sprs_array_get_block no block found",-1);
    }
    pnga_distribution(SPA[lVar4].g_i,irow,&offset,&dummy);
    lVar5 = (*ihi - *ilo) + 2;
    lo[0] = lVar5 * (int)params[6] + offset;
    hi[0] = offset + ((int)params[6] + 1) * lVar5 + -1;
    pnga_get(SPA[lVar4].g_i,lo,hi,*idx,ld);
    lVar3 = 1;
  }
  return lVar3;
}

Assistant:

logical pnga_sprs_array_get_block(Integer s_a, Integer irow, Integer icol,
   void **idx, void **jdx, void **data, Integer *ilo, Integer *ihi,
    Integer *jlo, Integer *jhi)
{
  Integer hdl = GA_OFFSET + s_a;
  int64_t params[7];
  Integer lo[3], hi[3];
  Integer ld[2];
  int64_t len;
  int longidx;
  int i, index;
  Integer offset, dummy;
  logical ret = 1;

  /* retrieve location of block in distributed arrays */
  lo[0] = 1;
  lo[1] = irow+1;
  lo[2] = icol+1;
  hi[0] = 7;
  hi[1] = irow+1;
  hi[2] = icol+1;
  ld[0] = 7;
  ld[1] = 1;
  pnga_get(SPA[hdl].g_blk,lo,hi,params,ld);

  *ilo = params[0];
  *ihi = params[1];
  *jlo = params[2];
  *jhi = params[3];
  /* allocate arrays to hold block */
  len = params[5]-params[4]+1;
  index = params[6];
  /*
  printf("p[%ld] Getting block [%d,%d] ilo: %ld ihi: %ld jlo: %ld jhi: %ld len: %ld clo: %ld chi: %ld\n",
      pnga_nodeid(),irow,icol,*ilo,*ihi,*jlo,*jhi,len,params[4],params[5]);
      */
  if (len > 0) {
    *idx = (Integer*)malloc((*ihi-*ilo+2)*sizeof(Integer));
    *jdx = (Integer*)malloc(len*sizeof(Integer));
    *data = malloc(len*SPA[hdl].size);
    lo[0] = params[4];
    hi[0] = params[5];
    ld[0] = 1;
    pnga_get(SPA[hdl].g_j,lo,hi,*jdx,ld);
    pnga_get(SPA[hdl].g_data,lo,hi,*data,ld);

    if (index == -1) {
      printf("p[%d] irow: %d icol: %d iblk: %d ilo: %d ihi: %d jlo: %d jhi: %d len: %d\n",
          pnga_nodeid(),irow,icol,index,*ilo,*ihi,*jlo,*jhi,len);
      pnga_error("sprs_array_get_block no block found",index);
    }
    pnga_distribution(SPA[hdl].g_i,irow,&offset,&dummy);
    lo[0] = offset+index*(*ihi-*ilo+2);
    hi[0] = offset+(index+1)*(*ihi-*ilo+2)-1;
    pnga_get(SPA[hdl].g_i,lo,hi,*idx,ld);
    /*
    printf("p[%ld] row offsets in get_block for block: %ld icol %ld\n",
        pnga_nodeid(),index,SPA[hdl].blkidx[index]);
    for (i=lo[0]; i<hi[0]; i++) {
      int64_t *ptr = (int64_t*)*idx;
      printf("p[%ld]     row: %ld idx: %ld idx+1: %ld",pnga_nodeid(),
          i,ptr[i-lo[0]],ptr[i+1-lo[0]]);
      if (ptr[i+1-lo[0]]-ptr[i-lo[0]] > 0) {
        printf(" first j: %ld val: %d\n",
            ((int64_t*)(*jdx))[ptr[i-lo[0]]],
            ((int*)(*data))[ptr[i-lo[0]]]);
      } else {
        printf("\n");
      }
    }
    */
  } else {
    /* block has no data */
    *idx == NULL;
    *jdx == NULL;
    *data == NULL;
    ret = 0;
  }
  return ret;
}